

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_auth_act(connectdata *conn)

{
  int iVar1;
  SessionHandle *data;
  SessionHandle *pSVar2;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  char *pcVar6;
  
  data = conn->data;
  iVar1 = (data->req).httpcode;
  if (iVar1 - 100U < 100) {
    return CURLE_OK;
  }
  if ((data->state).authproblem == true) {
    if ((data->set).http_fail_on_error == false) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  if ((conn->bits).user_passwd == true) {
    if (iVar1 == 0x191) {
LAB_004c68f0:
      _Var4 = pickoneauth(&(data->state).authhost);
      bVar3 = true;
      if (!_Var4) {
        (data->state).authproblem = true;
        goto LAB_004c690a;
      }
    }
    else {
      bVar3 = false;
      if ((iVar1 < 300) && (bVar3 = false, (conn->bits).authneg != false)) goto LAB_004c68f0;
    }
  }
  else {
LAB_004c690a:
    bVar3 = false;
  }
  if (((conn->bits).proxy_user_passwd == true) &&
     ((iVar1 = (data->req).httpcode, iVar1 == 0x197 ||
      ((iVar1 < 300 && ((conn->bits).authneg != false)))))) {
    _Var4 = pickoneauth(&(data->state).authproxy);
    if (!_Var4) {
      (data->state).authproblem = true;
      goto LAB_004c694b;
    }
LAB_004c6950:
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    pcVar6 = (*Curl_cstrdup)((data->change).url);
    (data->req).newurl = pcVar6;
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (((((data->set).httpreq | HTTPREQ_PUT) != HTTPREQ_HEAD) &&
        ((conn->bits).rewindaftersend == false)) &&
       (CVar5 = http_perhapsrewind(conn), CVar5 != CURLE_OK)) {
      return CVar5;
    }
  }
  else {
LAB_004c694b:
    if (bVar3) goto LAB_004c6950;
    if (((((data->req).httpcode < 300) && ((data->state).authhost.done == false)) &&
        ((conn->bits).authneg == true)) && (((data->set).httpreq | HTTPREQ_PUT) != HTTPREQ_HEAD)) {
      pcVar6 = (*Curl_cstrdup)((data->change).url);
      (data->req).newurl = pcVar6;
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->state).authhost.done = true;
    }
  }
  pSVar2 = conn->data;
  iVar1 = (pSVar2->req).httpcode;
  if ((399 < iVar1 & (pSVar2->set).http_fail_on_error) != 1) {
    return CURLE_OK;
  }
  if (iVar1 == 0x197) {
    if ((conn->bits).proxy_user_passwd != true) goto LAB_004c6a5d;
  }
  else if ((iVar1 != 0x191) || ((conn->bits).user_passwd == false)) goto LAB_004c6a5d;
  if ((pSVar2->state).authproblem == false) {
    return CURLE_OK;
  }
LAB_004c6a5d:
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return CURLE_HTTP_RETURNED_ERROR;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if(conn->bits.user_passwd &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost);
    if(!pickhost)
      data->state.authproblem = TRUE;
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;

    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
  }

  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf (data, "The requested URL returned error: %d",
           data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}